

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointAddition::test_method(PointAddition *this)

{
  int local_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  RealScalar local_378;
  undefined1 local_370;
  undefined8 local_368;
  shared_count sStack_360;
  undefined **local_358;
  undefined1 local_350;
  undefined8 *local_348;
  char **local_340;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_330;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_2d8 [7];
  RealSpace R3;
  Point x;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_398 = 0x3ff0000000000000;
  uStack_390 = 0x4000000000000000;
  local_388 = 0x4008000000000000;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_2d8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_398,(type *)0x0);
  mnf::Manifold::createPoint((Ref *)&x);
  free(local_2d8[0].m_rhs);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_358,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_398,(type *)0x0);
  mnf::operator+((Point *)local_2d8,(Ref *)&x);
  mnf::Point::operator=(&x,(Point *)local_2d8);
  mnf::Point::~Point((Point *)local_2d8);
  free(local_340);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,100);
  mnf::SubPoint::value();
  local_39c = 2;
  Eigen::operator*(local_2d8,&local_39c,(StorageBaseType *)&local_398);
  local_378 = 1e-12;
  local_370 = Eigen::internal::
              isApprox_selector<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_false>
              ::run(&local_330,local_2d8,&local_378);
  local_368 = 0;
  sStack_360.pi_ = (sp_counted_base *)0x0;
  local_340 = &local_308;
  local_308 = "x.value().isApprox(2 * v)";
  local_300 = "";
  local_350 = 0;
  local_358 = &PTR__lazy_ostream_0013ec40;
  local_348 = &boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_310 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_360);
  mnf::Point::~Point(&x);
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointAddition)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);

  Point x = R3.createPoint(v);
  x = x + v;
  BOOST_CHECK(x.value().isApprox(2 * v));
}